

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_vdf.c
# Opt level: O0

void * VDF_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  int iVar13;
  PHYSFS_sint64 ts;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  void *unpkarc;
  PHYSFS_uint32 local_68;
  PHYSFS_uint32 rootCatOffset;
  PHYSFS_uint32 dataSize;
  PHYSFS_uint32 version;
  PHYSFS_uint32 timestamp;
  PHYSFS_uint32 count;
  PHYSFS_uint8 sig [16];
  PHYSFS_uint8 ignore [16];
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_vdf.c"
                  ,0x68,"void *VDF_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar13 = (*io->seek)(io,0x100);
    if (iVar13 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      iVar13 = __PHYSFS_readAll(io,&timestamp,0x10);
      if (iVar13 == 0) {
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        cVar14 = -(timestamp._2_1_ == VDF_SIGNATURE_G1[2]);
        cVar15 = -(timestamp._3_1_ == VDF_SIGNATURE_G1[3]);
        cVar16 = -((char)count == VDF_SIGNATURE_G1[4]);
        cVar17 = -(count._1_1_ == VDF_SIGNATURE_G1[5]);
        cVar18 = -(count._2_1_ == VDF_SIGNATURE_G1[6]);
        cVar19 = -(count._3_1_ == VDF_SIGNATURE_G1[7]);
        cVar20 = -(sig[0] == VDF_SIGNATURE_G1[8]);
        cVar21 = -(sig[1] == VDF_SIGNATURE_G1[9]);
        cVar22 = -(sig[2] == VDF_SIGNATURE_G1[10]);
        cVar23 = -(sig[3] == VDF_SIGNATURE_G1[0xb]);
        cVar24 = -(sig[4] == VDF_SIGNATURE_G1[0xc]);
        cVar25 = -(sig[5] == VDF_SIGNATURE_G1[0xd]);
        cVar26 = -(sig[6] == VDF_SIGNATURE_G1[0xe]);
        bVar27 = -(sig[7] == VDF_SIGNATURE_G1[0xf]);
        auVar1[1] = -(timestamp._1_1_ == VDF_SIGNATURE_G1[1]);
        auVar1[0] = -((char)timestamp == *VDF_SIGNATURE_G1);
        auVar1[2] = cVar14;
        auVar1[3] = cVar15;
        auVar1[4] = cVar16;
        auVar1[5] = cVar17;
        auVar1[6] = cVar18;
        auVar1[7] = cVar19;
        auVar1[8] = cVar20;
        auVar1[9] = cVar21;
        auVar1[10] = cVar22;
        auVar1[0xb] = cVar23;
        auVar1[0xc] = cVar24;
        auVar1[0xd] = cVar25;
        auVar1[0xe] = cVar26;
        auVar1[0xf] = bVar27;
        auVar2[1] = -(timestamp._1_1_ == VDF_SIGNATURE_G1[1]);
        auVar2[0] = -((char)timestamp == *VDF_SIGNATURE_G1);
        auVar2[2] = cVar14;
        auVar2[3] = cVar15;
        auVar2[4] = cVar16;
        auVar2[5] = cVar17;
        auVar2[6] = cVar18;
        auVar2[7] = cVar19;
        auVar2[8] = cVar20;
        auVar2[9] = cVar21;
        auVar2[10] = cVar22;
        auVar2[0xb] = cVar23;
        auVar2[0xc] = cVar24;
        auVar2[0xd] = cVar25;
        auVar2[0xe] = cVar26;
        auVar2[0xf] = bVar27;
        auVar11[1] = cVar15;
        auVar11[0] = cVar14;
        auVar11[2] = cVar16;
        auVar11[3] = cVar17;
        auVar11[4] = cVar18;
        auVar11[5] = cVar19;
        auVar11[6] = cVar20;
        auVar11[7] = cVar21;
        auVar11[8] = cVar22;
        auVar11[9] = cVar23;
        auVar11[10] = cVar24;
        auVar11[0xb] = cVar25;
        auVar11[0xc] = cVar26;
        auVar11[0xd] = bVar27;
        auVar9[1] = cVar16;
        auVar9[0] = cVar15;
        auVar9[2] = cVar17;
        auVar9[3] = cVar18;
        auVar9[4] = cVar19;
        auVar9[5] = cVar20;
        auVar9[6] = cVar21;
        auVar9[7] = cVar22;
        auVar9[8] = cVar23;
        auVar9[9] = cVar24;
        auVar9[10] = cVar25;
        auVar9[0xb] = cVar26;
        auVar9[0xc] = bVar27;
        auVar7[1] = cVar17;
        auVar7[0] = cVar16;
        auVar7[2] = cVar18;
        auVar7[3] = cVar19;
        auVar7[4] = cVar20;
        auVar7[5] = cVar21;
        auVar7[6] = cVar22;
        auVar7[7] = cVar23;
        auVar7[8] = cVar24;
        auVar7[9] = cVar25;
        auVar7[10] = cVar26;
        auVar7[0xb] = bVar27;
        auVar5[1] = cVar18;
        auVar5[0] = cVar17;
        auVar5[2] = cVar19;
        auVar5[3] = cVar20;
        auVar5[4] = cVar21;
        auVar5[5] = cVar22;
        auVar5[6] = cVar23;
        auVar5[7] = cVar24;
        auVar5[8] = cVar25;
        auVar5[9] = cVar26;
        auVar5[10] = bVar27;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,CONCAT16(cVar24
                                                  ,CONCAT15(cVar23,CONCAT14(cVar22,CONCAT13(cVar21,
                                                  CONCAT12(cVar20,CONCAT11(cVar19,cVar18))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24
                                                  ,CONCAT14(cVar23,CONCAT13(cVar22,CONCAT12(cVar21,
                                                  CONCAT11(cVar20,cVar19)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar27 >> 7) << 0xf) != 0xffff) {
          cVar14 = -(timestamp._2_1_ == VDF_SIGNATURE_G2[2]);
          cVar15 = -(timestamp._3_1_ == VDF_SIGNATURE_G2[3]);
          cVar16 = -((char)count == VDF_SIGNATURE_G2[4]);
          cVar17 = -(count._1_1_ == VDF_SIGNATURE_G2[5]);
          cVar18 = -(count._2_1_ == VDF_SIGNATURE_G2[6]);
          cVar19 = -(count._3_1_ == VDF_SIGNATURE_G2[7]);
          cVar20 = -(sig[0] == VDF_SIGNATURE_G2[8]);
          cVar21 = -(sig[1] == VDF_SIGNATURE_G2[9]);
          cVar22 = -(sig[2] == VDF_SIGNATURE_G2[10]);
          cVar23 = -(sig[3] == VDF_SIGNATURE_G2[0xb]);
          cVar24 = -(sig[4] == VDF_SIGNATURE_G2[0xc]);
          cVar25 = -(sig[5] == VDF_SIGNATURE_G2[0xd]);
          cVar26 = -(sig[6] == VDF_SIGNATURE_G2[0xe]);
          bVar27 = -(sig[7] == VDF_SIGNATURE_G2[0xf]);
          auVar3[1] = -(timestamp._1_1_ == VDF_SIGNATURE_G2[1]);
          auVar3[0] = -((char)timestamp == *VDF_SIGNATURE_G2);
          auVar3[2] = cVar14;
          auVar3[3] = cVar15;
          auVar3[4] = cVar16;
          auVar3[5] = cVar17;
          auVar3[6] = cVar18;
          auVar3[7] = cVar19;
          auVar3[8] = cVar20;
          auVar3[9] = cVar21;
          auVar3[10] = cVar22;
          auVar3[0xb] = cVar23;
          auVar3[0xc] = cVar24;
          auVar3[0xd] = cVar25;
          auVar3[0xe] = cVar26;
          auVar3[0xf] = bVar27;
          auVar4[1] = -(timestamp._1_1_ == VDF_SIGNATURE_G2[1]);
          auVar4[0] = -((char)timestamp == *VDF_SIGNATURE_G2);
          auVar4[2] = cVar14;
          auVar4[3] = cVar15;
          auVar4[4] = cVar16;
          auVar4[5] = cVar17;
          auVar4[6] = cVar18;
          auVar4[7] = cVar19;
          auVar4[8] = cVar20;
          auVar4[9] = cVar21;
          auVar4[10] = cVar22;
          auVar4[0xb] = cVar23;
          auVar4[0xc] = cVar24;
          auVar4[0xd] = cVar25;
          auVar4[0xe] = cVar26;
          auVar4[0xf] = bVar27;
          auVar12[1] = cVar15;
          auVar12[0] = cVar14;
          auVar12[2] = cVar16;
          auVar12[3] = cVar17;
          auVar12[4] = cVar18;
          auVar12[5] = cVar19;
          auVar12[6] = cVar20;
          auVar12[7] = cVar21;
          auVar12[8] = cVar22;
          auVar12[9] = cVar23;
          auVar12[10] = cVar24;
          auVar12[0xb] = cVar25;
          auVar12[0xc] = cVar26;
          auVar12[0xd] = bVar27;
          auVar10[1] = cVar16;
          auVar10[0] = cVar15;
          auVar10[2] = cVar17;
          auVar10[3] = cVar18;
          auVar10[4] = cVar19;
          auVar10[5] = cVar20;
          auVar10[6] = cVar21;
          auVar10[7] = cVar22;
          auVar10[8] = cVar23;
          auVar10[9] = cVar24;
          auVar10[10] = cVar25;
          auVar10[0xb] = cVar26;
          auVar10[0xc] = bVar27;
          auVar8[1] = cVar17;
          auVar8[0] = cVar16;
          auVar8[2] = cVar18;
          auVar8[3] = cVar19;
          auVar8[4] = cVar20;
          auVar8[5] = cVar21;
          auVar8[6] = cVar22;
          auVar8[7] = cVar23;
          auVar8[8] = cVar24;
          auVar8[9] = cVar25;
          auVar8[10] = cVar26;
          auVar8[0xb] = bVar27;
          auVar6[1] = cVar18;
          auVar6[0] = cVar17;
          auVar6[2] = cVar19;
          auVar6[3] = cVar20;
          auVar6[4] = cVar21;
          auVar6[5] = cVar22;
          auVar6[6] = cVar23;
          auVar6[7] = cVar24;
          auVar6[8] = cVar25;
          auVar6[9] = cVar26;
          auVar6[10] = bVar27;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,CONCAT16(
                                                  cVar24,CONCAT15(cVar23,CONCAT14(cVar22,CONCAT13(
                                                  cVar21,CONCAT12(cVar20,CONCAT11(cVar19,cVar18)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(
                                                  cVar24,CONCAT14(cVar23,CONCAT13(cVar22,CONCAT12(
                                                  cVar21,CONCAT11(cVar20,cVar19)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar27 >> 7) << 0xf) != 0xffff) {
            PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
            return (void *)0x0;
          }
        }
        *claimed = 1;
        iVar13 = readui32(io,&version);
        if (iVar13 == 0) {
          io_local = (PHYSFS_Io *)0x0;
        }
        else {
          iVar13 = __PHYSFS_readAll(io,sig + 8,4);
          if (iVar13 == 0) {
            io_local = (PHYSFS_Io *)0x0;
          }
          else {
            iVar13 = readui32(io,&dataSize);
            if (iVar13 == 0) {
              io_local = (PHYSFS_Io *)0x0;
            }
            else {
              iVar13 = readui32(io,&local_68);
              if (iVar13 == 0) {
                io_local = (PHYSFS_Io *)0x0;
              }
              else {
                iVar13 = readui32(io,(PHYSFS_uint32 *)((long)&unpkarc + 4));
                if (iVar13 == 0) {
                  io_local = (PHYSFS_Io *)0x0;
                }
                else {
                  iVar13 = readui32(io,&rootCatOffset);
                  if (iVar13 == 0) {
                    io_local = (PHYSFS_Io *)0x0;
                  }
                  else if (rootCatOffset == 0x50) {
                    iVar13 = (*io->seek)(io,(PHYSFS_uint64)unpkarc._4_4_);
                    if (iVar13 == 0) {
                      io_local = (PHYSFS_Io *)0x0;
                    }
                    else {
                      io_local = (PHYSFS_Io *)UNPK_openArchive(io);
                      if (io_local == (PHYSFS_Io *)0x0) {
                        io_local = (PHYSFS_Io *)0x0;
                      }
                      else {
                        ts = vdfDosTimeToEpoch(dataSize);
                        iVar13 = vdfLoadEntries(io,version,ts,io_local);
                        if (iVar13 == 0) {
                          UNPK_abandonArchive(io_local);
                          io_local = (PHYSFS_Io *)0x0;
                        }
                      }
                    }
                  }
                  else {
                    PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
                    io_local = (PHYSFS_Io *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *VDF_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 ignore[16];
    PHYSFS_uint8 sig[VDF_SIGNATURE_LENGTH];
    PHYSFS_uint32 count, timestamp, version, dataSize, rootCatOffset;
    void *unpkarc;

    assert(io != NULL); /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    /* skip the 256-byte comment field. */
    BAIL_IF_ERRPASS(!io->seek(io, VDF_COMMENT_LENGTH), NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, sig, sizeof (sig)), NULL);

    if ((memcmp(sig, VDF_SIGNATURE_G1, VDF_SIGNATURE_LENGTH) != 0) &&
        (memcmp(sig, VDF_SIGNATURE_G2, VDF_SIGNATURE_LENGTH) != 0))
    {
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);
    } /* if */

    *claimed = 1;

    BAIL_IF_ERRPASS(!readui32(io, &count), NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), NULL);  /* numFiles */
    BAIL_IF_ERRPASS(!readui32(io, &timestamp), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &dataSize), NULL);  /* dataSize */
    BAIL_IF_ERRPASS(!readui32(io, &rootCatOffset), NULL);  /* rootCatOff */
    BAIL_IF_ERRPASS(!readui32(io, &version), NULL);

    BAIL_IF(version != 0x50, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!io->seek(io, rootCatOffset), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!vdfLoadEntries(io, count, vdfDosTimeToEpoch(timestamp), unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}